

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefSite.h
# Opt level: O3

DefSiteSet * __thiscall
dg::dda::DefSiteSet::intersect(DefSiteSet *__return_storage_ptr__,DefSiteSet *this,DefSiteSet *rhs)

{
  RWNode *pRVar1;
  RWNode *pRVar2;
  _Link_type p_Var3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  undefined8 uVar7;
  _List_node_base *p_Var8;
  mapped_type *pmVar9;
  _Base_ptr p_Var10;
  IntervalsList *pIVar11;
  _List_node_base *p_Var12;
  Offset OVar13;
  _Link_type p_Var14;
  _Link_type p_Var15;
  _Link_type p_Var16;
  _Rb_tree_header *p_Var17;
  DefSiteSet *retval;
  map<dg::dda::RWNode_*,_dg::dda::IntervalsList,_std::less<dg::dda::RWNode_*>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>_>
  rhssites;
  map<dg::dda::RWNode_*,_dg::dda::IntervalsList,_std::less<dg::dda::RWNode_*>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>_>
  lhssites;
  pair<dg::Offset,_dg::Offset> local_a0;
  undefined1 local_90 [16];
  _Link_type local_80;
  _Base_ptr local_78;
  _Base_ptr local_70;
  size_t local_68;
  _Rb_tree<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>,_std::_Select1st<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>,_std::less<dg::dda::RWNode_*>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_78 = (_Base_ptr)(local_90 + 8);
  local_90._8_4_ = _S_red;
  local_80 = (_Link_type)0x0;
  local_68 = 0;
  p_Var10 = (this->
            super_set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
            )._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var17 = &(this->
             super_set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
             )._M_t._M_impl.super__Rb_tree_header;
  local_70 = local_78;
  if ((_Rb_tree_header *)p_Var10 != p_Var17) {
    do {
      pmVar9 = std::
               map<dg::dda::RWNode_*,_dg::dda::IntervalsList,_std::less<dg::dda::RWNode_*>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>_>
               ::operator[]((map<dg::dda::RWNode_*,_dg::dda::IntervalsList,_std::less<dg::dda::RWNode_*>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>_>
                             *)&local_60,(key_type *)(p_Var10 + 1));
      local_a0 = GenericDefSite<dg::dda::RWNode>::getInterval
                           ((GenericDefSite<dg::dda::RWNode> *)(p_Var10 + 1));
      IntervalsList::add(pmVar9,(Interval *)&local_a0);
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
    } while ((_Rb_tree_header *)p_Var10 != p_Var17);
  }
  p_Var10 = (rhs->
            super_set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
            )._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var17 = &(rhs->
             super_set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
             )._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var10 != p_Var17) {
    do {
      pmVar9 = std::
               map<dg::dda::RWNode_*,_dg::dda::IntervalsList,_std::less<dg::dda::RWNode_*>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>_>
               ::operator[]((map<dg::dda::RWNode_*,_dg::dda::IntervalsList,_std::less<dg::dda::RWNode_*>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>_>
                             *)local_90,(key_type *)(p_Var10 + 1));
      local_a0 = GenericDefSite<dg::dda::RWNode>::getInterval
                           ((GenericDefSite<dg::dda::RWNode> *)(p_Var10 + 1));
      IntervalsList::add(pmVar9,(Interval *)&local_a0);
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
    } while ((_Rb_tree_header *)p_Var10 != p_Var17);
  }
  p_Var17 = &(__return_storage_ptr__->
             super_set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
             )._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->
  super_set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
  )._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->
  super_set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
  )._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->
  super_set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
  )._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var17->_M_header;
  (__return_storage_ptr__->
  super_set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
  )._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var17->_M_header;
  (__return_storage_ptr__->
  super_set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
  )._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var8 = Offset::UNKNOWN;
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_60._M_impl.super__Rb_tree_header) {
    uVar7 = Offset::UNKNOWN + 0xffffffffffffffff;
    p_Var10 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      if (local_80 != (_Link_type)0x0) {
        pRVar1 = *(RWNode **)(p_Var10 + 1);
        p_Var16 = (_Link_type)(local_90 + 8);
        p_Var3 = local_80;
        do {
          p_Var14 = p_Var3;
          p_Var15 = p_Var16;
          pRVar2 = *(RWNode **)(p_Var14->_M_storage)._M_storage;
          p_Var16 = p_Var14;
          if (pRVar2 < pRVar1) {
            p_Var16 = p_Var15;
          }
          p_Var3 = *(_Link_type *)
                    ((p_Var14->_M_storage)._M_storage + (ulong)(pRVar2 < pRVar1) * 8 + -0x10);
        } while (p_Var3 != (_Link_type)0x0);
        if (p_Var16 != (_Link_type)(local_90 + 8)) {
          if (pRVar2 < pRVar1) {
            p_Var14 = p_Var15;
          }
          if (*(RWNode **)(p_Var14->_M_storage)._M_storage <= pRVar1) {
            pIVar11 = IntervalsList::intersectWith
                                ((IntervalsList *)&p_Var10[1]._M_parent,
                                 (IntervalsList *)((p_Var16->_M_storage)._M_storage + 8));
            for (p_Var4 = (pIVar11->intervals).
                          super__List_base<dg::dda::IntervalsList::Interval,_std::allocator<dg::dda::IntervalsList::Interval>_>
                          ._M_impl._M_node.super__List_node_base._M_next;
                p_Var4 != (_List_node_base *)pIVar11;
                p_Var4 = (((list<dg::dda::IntervalsList::Interval,_std::allocator<dg::dda::IntervalsList::Interval>_>
                            *)&p_Var4->_M_next)->
                         super__List_base<dg::dda::IntervalsList::Interval,_std::allocator<dg::dda::IntervalsList::Interval>_>
                         )._M_impl._M_node.super__List_node_base._M_next) {
              p_Var5 = *(_List_node_base **)&((IntervalsList *)((long)(p_Var4 + 1) + 8))->intervals;
              p_Var12 = p_Var8;
              if (p_Var5 != p_Var8) {
                p_Var6 = *(_List_node_base **)
                          &((list<dg::dda::IntervalsList::Interval,_std::allocator<dg::dda::IntervalsList::Interval>_>
                             *)(p_Var4 + 1))->
                           super__List_base<dg::dda::IntervalsList::Interval,_std::allocator<dg::dda::IntervalsList::Interval>_>
                ;
                p_Var12 = (_List_node_base *)((long)p_Var5 - (long)p_Var6);
                if (p_Var5 < p_Var6) {
                  p_Var12 = p_Var8;
                }
                if (p_Var6 == p_Var8) {
                  p_Var12 = p_Var8;
                }
              }
              OVar13.offset = (type)((long)&p_Var12->_M_next + 1);
              if ((ulong)(uVar7 + 0xf) <= p_Var12) {
                OVar13.offset = (type)p_Var8;
              }
              if (p_Var12 == p_Var8) {
                OVar13.offset = (type)p_Var8;
              }
              local_a0.first.offset = OVar13.offset;
              std::
              _Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,dg::dda::GenericDefSite<dg::dda::RWNode>,std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::less<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>>>
              ::_M_emplace_unique<dg::dda::RWNode*const&,dg::Offset_const&,dg::Offset>
                        ((_Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,dg::dda::GenericDefSite<dg::dda::RWNode>,std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::less<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>>>
                          *)__return_storage_ptr__,(RWNode **)(p_Var10 + 1),(Offset *)(p_Var4 + 1),
                         &local_a0.first);
            }
          }
        }
      }
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
    } while ((_Rb_tree_header *)p_Var10 != &local_60._M_impl.super__Rb_tree_header);
  }
  std::
  _Rb_tree<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>,_std::_Select1st<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>,_std::less<dg::dda::RWNode_*>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>_>
  ::_M_erase((_Rb_tree<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>,_std::_Select1st<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>,_std::less<dg::dda::RWNode_*>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>_>
              *)local_90,local_80);
  std::
  _Rb_tree<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>,_std::_Select1st<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>,_std::less<dg::dda::RWNode_*>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>_>
  ::_M_erase(&local_60,(_Link_type)local_60._M_impl.super__Rb_tree_header._M_header._M_parent);
  return __return_storage_ptr__;
}

Assistant:

DefSiteSet intersect(const DefSiteSet &rhs) const {
        std::map<DefSite::NodeTy *, IntervalsList> lhssites;
        std::map<DefSite::NodeTy *, IntervalsList> rhssites;

        for (const auto &ds : *this) {
            lhssites[ds.target].add(ds.getInterval());
        }
        for (const auto &ds : rhs) {
            rhssites[ds.target].add(ds.getInterval());
        }

        DefSiteSet retval;

        for (auto &lit : lhssites) {
            auto rit = rhssites.find(lit.first);
            if (rit != rhssites.end()) {
                for (const auto &I : lit.second.intersectWith(rit->second)) {
                    retval.emplace(lit.first, I.start, I.length());
                }
            }
        }

        return retval;
    }